

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

lws_tokenize_elem lws_tokenize(lws_tokenize *ts)

{
  byte *pbVar1;
  size_t sVar2;
  byte c;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  lws_tokenize_elem lVar11;
  size_t sVar12;
  void *pvVar13;
  bool bVar14;
  uint uVar15;
  uint __c;
  uint uVar16;
  uint uVar17;
  long lVar18;
  byte *pbVar19;
  bool bVar20;
  char local_7c;
  
  uVar3 = ts->flags;
  uVar17 = 0;
  local_7c = ((uVar3 >> 6 & 1) != 0) + -1;
  uVar15 = uVar3 & 1;
  uVar6 = 0x2d;
  if ((uVar3 & 1) != 0) {
    uVar15 = 0x2d;
    uVar6 = 0;
  }
  uVar16 = uVar3 & 0x10;
  uVar7 = 0x2e;
  if ((uVar3 & 0x10) != 0) {
    uVar16 = 0x2e;
    uVar7 = 0;
  }
  uVar8 = 0x2a;
  uVar4 = 0;
  if ((uVar3 >> 9 & 1) == 0) {
    uVar8 = uVar17;
    uVar4 = 0x2a;
  }
  uVar9 = 0x3d;
  uVar5 = 0;
  if ((uVar3 >> 10 & 1) == 0) {
    uVar9 = uVar17;
    uVar5 = 0x3d;
  }
  ts->token = (char *)0x0;
  ts->token_len = 0;
  if (ts->len == 0) {
    bVar20 = true;
    bVar14 = false;
  }
  else {
    bVar20 = true;
    iVar10 = 0;
    bVar14 = false;
    lVar18 = 0;
    sVar12 = ts->len;
    pbVar19 = (byte *)ts->start;
    do {
      uVar17 = (uint)lVar18;
      pbVar1 = pbVar19 + 1;
      ts->start = (char *)pbVar1;
      c = *pbVar19;
      sVar2 = sVar12 - 1;
      ts->len = sVar2;
      iVar10 = lws_check_byte_utf8((uchar)iVar10,c);
      if (iVar10 < 0) {
        return LWS_TOKZE_ERR_BROKEN_UTF8;
      }
      if (c == 0) break;
      if ((((bVar20) || (c == 0xd)) || (c == 10)) &&
         (((-1 < (char)uVar3 || (uVar17 == 1)) || (c != 0x23)))) {
        if (c < 0x23) {
          if ((0x100003600U >> ((ulong)c & 0x3f) & 1) != 0) {
            lVar11 = (*(code *)(&DAT_001402a0 + *(int *)(&DAT_001402a0 + lVar18 * 4)))();
            return lVar11;
          }
          if ((ulong)c == 0x22) {
            if (uVar17 == 1) {
              return LWS_TOKZE_QUOTED_STRING;
            }
            if ((uVar3 & 4) != 0) {
              if (ts->delim == '\x01') {
                return LWS_TOKZE_ERR_COMMA_LIST;
              }
              ts->delim = '\x01';
            }
            ts->token = (char *)pbVar1;
            ts->token_len = 0;
            bVar20 = true;
            lVar18 = 1;
            goto LAB_0010c87a;
          }
        }
        if (((uVar17 & 0xfffffffe) == 2 && (uVar3 >> 10 & 1) == 0) && c == 0x3d) {
          if (local_7c == '\x01') {
            return LWS_TOKZE_ERR_NUM_ON_LHS;
          }
          return LWS_TOKZE_ERRS;
        }
        if (((c == 0x3a && (uVar17 & 0xfffffffe) == 2) & (byte)((uVar3 & 2) >> 1)) != 0) {
          return LWS_TOKZE_TOKEN_NAME_COLON;
        }
        if (((c == 0x2e) && ((uVar3 & 0x20) == 0)) && ((uVar17 == 2 && (local_7c == '\x01')))) {
          if (bVar14) {
            return LWS_TOKZE_ERR_MALFORMED_FLOAT;
          }
          ts->token_len = ts->token_len + 1;
          bVar14 = true;
          lVar18 = 2;
          bVar20 = true;
        }
        else if (((iVar10 == 0) &&
                 (((((__c = (uint)(char)c, (uVar3 & 8) != 0 &&
                     (pvVar13 = memchr("(),/:;<=>?@[\\]{}",__c,0x11), ' ' < (char)c)) &&
                    (pvVar13 != (void *)0x0)) ||
                   ((((uVar3 & 8) == 0 && ((byte)(c - 0x3a) < 0xf6)) &&
                    (((byte)(c + 0xa5) < 0xe6 &&
                     (((uVar8 != __c && uVar16 != __c) &&
                      ((uVar15 != __c && c != 0x5f) && (byte)(c + 0x85) < 0xe6)) && uVar9 != __c))))
                   )) || ((((uVar6 == __c || (uVar7 == __c)) || (uVar4 == __c)) || (uVar5 == __c))))
                 )) && (((uVar3 >> 8 & 1) == 0 || (c != 0x2f)))) {
          if (uVar17 != 1) {
            if (1 < uVar17 - 2) {
              if ((uVar3 & 4) != 0) {
                if (c != 0x2c) {
                  return LWS_TOKZE_ERR_COMMA_LIST;
                }
                if (ts->delim != '\x01') {
                  return LWS_TOKZE_ERR_COMMA_LIST;
                }
                ts->delim = '\x02';
              }
              ts->token = (char *)pbVar19;
              ts->token_len = 1;
              return LWS_TOKZE_DELIMITER;
            }
LAB_0010cb1f:
            ts->start = (char *)pbVar19;
            ts->len = sVar12;
            goto LAB_0010cb2b;
          }
          ts->token_len = ts->token_len + 1;
          iVar10 = 0;
          bVar20 = true;
          lVar18 = 1;
        }
        else {
          if (uVar17 - 1 < 2) {
            sVar12 = ts->token_len + 1;
          }
          else {
            if (uVar17 != 0) goto LAB_0010cb1f;
            if ((uVar3 & 4) != 0) {
              if (ts->delim == '\x01') {
                return LWS_TOKZE_ERR_COMMA_LIST;
              }
              ts->delim = '\x01';
            }
            ts->token = (char *)pbVar19;
            lVar18 = 2;
            sVar12 = 1;
          }
          ts->token_len = sVar12;
          bVar20 = true;
          if ((uVar3 & 0x40) == 0) {
            if ((byte)(c - 0x3a) < 0xf6) {
              local_7c = '\0';
            }
            else if (local_7c < '\0') {
              local_7c = '\x01';
            }
          }
        }
      }
      else {
        bVar20 = false;
      }
LAB_0010c87a:
      uVar17 = (uint)lVar18;
      sVar12 = sVar2;
      pbVar19 = pbVar1;
    } while (sVar2 != 0);
    bVar20 = iVar10 == 0;
  }
  lVar11 = LWS_TOKZE_ERR_BROKEN_UTF8;
  if ((bVar20) && (lVar11 = LWS_TOKZE_ERR_UNTERM_STRING, uVar17 != 1)) {
    if (uVar17 - 4 < 0xfffffffe) {
      if (((uVar3 & 4) == 0) || (lVar11 = LWS_TOKZE_ERR_COMMA_LIST, ts->delim != '\x02')) {
        lVar11 = LWS_TOKZE_ENDED;
      }
    }
    else {
LAB_0010cb2b:
      lVar11 = LWS_TOKZE_TOKEN;
      if (local_7c == '\x01') {
        lVar11 = LWS_TOKZE_FLOAT - (uint)!bVar14;
      }
    }
  }
  return lVar11;
}

Assistant:

lws_tokenize_elem
lws_tokenize(struct lws_tokenize *ts)
{
	const char *rfc7230_delims = "(),/:;<=>?@[\\]{}";
	lws_tokenize_state state = LWS_TOKZS_LEADING_WHITESPACE;
	char c, flo = 0, d_minus = '-', d_dot = '.', d_star = '*', s_minus = '\0',
	     s_dot = '\0', s_star = '\0', d_eq = '=', s_eq = '\0', skipping = 0;
	signed char num = (ts->flags & LWS_TOKENIZE_F_NO_INTEGERS) ? 0 : -1;
	int utf8 = 0;

	/* for speed, compute the effect of the flags outside the loop */

	if (ts->flags & LWS_TOKENIZE_F_MINUS_NONTERM) {
		d_minus = '\0';
		s_minus = '-';
	}
	if (ts->flags & LWS_TOKENIZE_F_DOT_NONTERM) {
		d_dot = '\0';
		s_dot = '.';
	}
	if (ts->flags & LWS_TOKENIZE_F_ASTERISK_NONTERM) {
		d_star = '\0';
		s_star = '*';
	}
	if (ts->flags & LWS_TOKENIZE_F_EQUALS_NONTERM) {
		d_eq = '\0';
		s_eq = '=';
	}

	ts->token = NULL;
	ts->token_len = 0;

	while (ts->len) {
		c = *ts->start++;
		ts->len--;

		utf8 = lws_check_byte_utf8((unsigned char)utf8, (unsigned char)c);
		if (utf8 < 0)
			return LWS_TOKZE_ERR_BROKEN_UTF8;

		if (!c)
			break;

		if (skipping) {
			if (c != '\r' && c != '\n')
				continue;
			else
				skipping = 0;
		}

		/* comment */

		if (ts->flags & LWS_TOKENIZE_F_HASH_COMMENT &&
		    state != LWS_TOKZS_QUOTED_STRING &&
		    c == '#') {
			skipping = 1;
			continue;
		}

		/* whitespace */

		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' ||
		    c == '\f') {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
			case LWS_TOKZS_TOKEN_POST_TERMINAL:
				continue;
			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;
			case LWS_TOKZS_TOKEN:
				/* we want to scan forward to look for = */

				state = LWS_TOKZS_TOKEN_POST_TERMINAL;
				continue;
			}
		}

		/* quoted string */

		if (c == '\"') {
			if (state == LWS_TOKZS_QUOTED_STRING)
				return LWS_TOKZE_QUOTED_STRING;

			/* starting a quoted string */

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_QUOTED_STRING;
			ts->token = ts->start;
			ts->token_len = 0;

			continue;
		}

		/* token= aggregation */

		if (!(ts->flags & LWS_TOKENIZE_F_EQUALS_NONTERM) &&
		    c == '=' && (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
				 state == LWS_TOKZS_TOKEN)) {
			if (num == 1)
				return LWS_TOKZE_ERR_NUM_ON_LHS;
			/* swallow the = */
			return LWS_TOKZE_TOKEN_NAME_EQUALS;
		}

		/* optional token: aggregation */

		if ((ts->flags & LWS_TOKENIZE_F_AGG_COLON) && c == ':' &&
		    (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
		     state == LWS_TOKZS_TOKEN))
			/* swallow the : */
			return LWS_TOKZE_TOKEN_NAME_COLON;

		/* aggregate . in a number as a float */

		if (c == '.' && !(ts->flags & LWS_TOKENIZE_F_NO_FLOATS) &&
		    state == LWS_TOKZS_TOKEN && num == 1) {
			if (flo)
				return LWS_TOKZE_ERR_MALFORMED_FLOAT;
			flo = 1;
			ts->token_len++;
			continue;
		}

		/*
		 * Delimiter... by default anything that:
		 *
		 *  - isn't matched earlier, or
		 *  - is [A-Z, a-z, 0-9, _], and
		 *  - is not a partial utf8 char
		 *
		 * is a "delimiter", it marks the end of a token and is itself
		 * reported as a single LWS_TOKZE_DELIMITER each time.
		 *
		 * However with LWS_TOKENIZE_F_RFC7230_DELIMS flag, tokens may
		 * contain any noncontrol character that isn't defined in
		 * rfc7230_delims, and only characters listed there are treated
		 * as delimiters.
		 */

		if (!utf8 &&
		     ((ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS &&
		     strchr(rfc7230_delims, c) && c > 32) ||
		    ((!(ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS) &&
		     (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
		     (c < 'a' || c > 'z') && c != '_') &&
		     c != s_minus && c != s_dot && c != s_star && c != s_eq) ||
		    c == d_minus || c == d_dot || c == d_star || c == d_eq
		    ) &&
		    !((ts->flags & LWS_TOKENIZE_F_SLASH_NONTERM) && c == '/')) {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
				if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
					if (c != ',' ||
					    ts->delim != LWSTZ_DT_NEED_DELIM)
						return LWS_TOKZE_ERR_COMMA_LIST;
					ts->delim = LWSTZ_DT_NEED_NEXT_CONTENT;
				}

				ts->token = ts->start - 1;
				ts->token_len = 1;
				return LWS_TOKZE_DELIMITER;

			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;

			case LWS_TOKZS_TOKEN_POST_TERMINAL:
			case LWS_TOKZS_TOKEN:
				/* report the delimiter next time */
				ts->start--;
				ts->len++;
				goto token_or_numeric;
			}
		}

		/* anything that's not whitespace or delimiter is payload */

		switch (state) {
		case LWS_TOKZS_LEADING_WHITESPACE:

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_TOKEN;
			ts->token = ts->start - 1;
			ts->token_len = 1;
			goto checknum;

		case LWS_TOKZS_QUOTED_STRING:
		case LWS_TOKZS_TOKEN:
			ts->token_len++;
checknum:
			if (!(ts->flags & LWS_TOKENIZE_F_NO_INTEGERS)) {
				if (c < '0' || c > '9')
					num = 0;
				else
					if (num < 0)
						num = 1;
			}
			continue;

		case LWS_TOKZS_TOKEN_POST_TERMINAL:
			/* report the new token next time */
			ts->start--;
			ts->len++;
			goto token_or_numeric;
		}
	}

	/* we ran out of content */

	if (utf8) /* ended partway through a multibyte char */
		return LWS_TOKZE_ERR_BROKEN_UTF8;

	if (state == LWS_TOKZS_QUOTED_STRING)
		return LWS_TOKZE_ERR_UNTERM_STRING;

	if (state != LWS_TOKZS_TOKEN_POST_TERMINAL &&
	    state != LWS_TOKZS_TOKEN) {
		if ((ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) &&
		     ts->delim == LWSTZ_DT_NEED_NEXT_CONTENT)
			return LWS_TOKZE_ERR_COMMA_LIST;

		return LWS_TOKZE_ENDED;
	}

	/* report the pending token */

token_or_numeric:

	if (num != 1)
		return LWS_TOKZE_TOKEN;
	if (flo)
		return LWS_TOKZE_FLOAT;

	return LWS_TOKZE_INTEGER;
}